

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PackedStructType *type,string_view overrideName)

{
  size_t sVar1;
  char *end;
  char *begin;
  FormatBuffer *this_00;
  string_view fmt;
  format_args args;
  ulong local_38 [3];
  
  begin = overrideName._M_str;
  sVar1 = overrideName._M_len;
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    printScope(this,(type->super_IntegralType).super_Type.super_Symbol.parentScope);
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    if (sVar1 == 0) {
      begin = "<unnamed packed struct>";
      end = "";
      goto LAB_0043e96d;
    }
  }
  else {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"struct packed","")
    ;
    if ((type->super_IntegralType).isSigned == true) {
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," signed","");
    }
    appendMembers(this,&type->super_Scope);
    if ((this->options).skipScopedTypeNames != false) {
      return;
    }
    if (sVar1 == 0) {
      printScope(this,(type->super_IntegralType).super_Type.super_Symbol.parentScope);
      local_38[0] = (ulong)(uint)type->systemId;
      fmt.size_ = 4;
      fmt.data_ = "s${}";
      args.field_1.values_ = (value<fmt::v11::context> *)local_38;
      args.desc_ = 1;
      ::fmt::v11::detail::vformat_to
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
                 (locale_ref)0x0);
      return;
    }
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  }
  end = begin + sVar1;
LAB_0043e96d:
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,begin,end);
  return;
}

Assistant:

void TypePrinter::visit(const PackedStructType& type, std::string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (overrideName.empty())
            buffer->append("<unnamed packed struct>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("struct packed");
        if (type.isSigned)
            buffer->append(" signed");

        appendMembers(type);

        if (options.skipScopedTypeNames)
            ;
        else if (!overrideName.empty())
            buffer->append(overrideName);
        else {
            printScope(type.getParentScope());
            buffer->format("s${}", type.systemId);
        }
    }
}